

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

string * cmsys::SystemTools::GetProgramPath(string *__return_storage_ptr__,string *in_name)

{
  undefined1 local_40 [8];
  string file;
  string *in_name_local;
  string *dir;
  
  file.field_2._M_local_buf[0xf] = '\0';
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  std::__cxx11::string::string((string *)local_40);
  SplitProgramPath(in_name,__return_storage_ptr__,(string *)local_40,true);
  file.field_2._M_local_buf[0xf] = '\x01';
  std::__cxx11::string::~string((string *)local_40);
  if ((file.field_2._M_local_buf[0xf] & 1U) == 0) {
    std::__cxx11::string::~string((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

kwsys_stl::string SystemTools::GetProgramPath(const kwsys_stl::string& in_name)
{
  kwsys_stl::string dir, file;
  SystemTools::SplitProgramPath(in_name, dir, file);
  return dir;
}